

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O1

PackageImportDeclarationSyntax * __thiscall
slang::parsing::Parser::parseImportDeclaration(Parser *this,AttrList attributes)

{
  Token keyword;
  bool bVar1;
  int iVar2;
  SourceLocation location;
  PackageImportItemSyntax *pPVar3;
  undefined4 extraout_var;
  PackageImportDeclarationSyntax *pPVar4;
  Info *extraout_RDX;
  Info *extraout_RDX_00;
  Info *extraout_RDX_01;
  Info *extraout_RDX_02;
  Info *src;
  Info *extraout_RDX_03;
  TokenKind kind;
  Token TVar5;
  Token TVar6;
  Token semi;
  SmallVector<slang::syntax::TokenOrSyntax,_4UL> items;
  Token local_148;
  Info *local_138;
  undefined8 local_130;
  pointer local_128;
  size_t local_120;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> local_118;
  ulong local_108;
  undefined8 uStack_100;
  size_t local_f8;
  pointer local_f0;
  size_t local_e8;
  undefined1 local_e0 [16];
  SyntaxNode *local_d0;
  SyntaxNode *pSStack_c8;
  pointer local_b8;
  SmallVectorBase<slang::syntax::TokenOrSyntax> local_a8 [2];
  
  local_120 = (size_t)attributes._M_extent._M_extent_value;
  local_128 = attributes._M_ptr;
  TVar5 = ParserBase::consume(&this->super_ParserBase);
  Token::Token(&local_148);
  local_a8[0].data_ = (pointer)local_a8[0].firstElement;
  local_a8[0].len = 0;
  local_a8[0].cap = 4;
  local_e0 = (undefined1  [16])ParserBase::peek(&this->super_ParserBase);
  bVar1 = slang::syntax::SyntaxFacts::isSemicolon(local_e0._0_2_);
  if (bVar1) {
    bVar1 = ParserBase::haveDiagAtCurrentLoc(&this->super_ParserBase);
    if (!bVar1) {
      location = Token::location((Token *)local_e0);
      ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x490005,location);
    }
    local_148 = ParserBase::expect(&this->super_ParserBase,Semicolon);
  }
  else {
    bVar1 = slang::syntax::SyntaxFacts::isIdentifierOrComma(local_e0._0_2_);
    if (!bVar1) {
      ParserBase::reportMissingList
                (&this->super_ParserBase,(Token)local_e0,Semicolon,&local_148,(DiagCode)0x490005);
      src = extraout_RDX_03;
      keyword = TVar5;
      goto LAB_001f0c5a;
    }
    do {
      local_138 = TVar5.info;
      local_130 = TVar5._0_8_;
      pPVar3 = parsePackageImportItem(this);
      local_118._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pPVar3;
      local_108 = CONCAT71(local_108._1_7_,1);
      SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                (local_a8,(TokenOrSyntax *)&local_118._M_first);
      TVar6 = ParserBase::peek(&this->super_ParserBase);
      bVar1 = slang::syntax::SyntaxFacts::isSemicolon(TVar6.kind);
      iVar2 = 3;
      src = extraout_RDX;
      if (TVar6.kind == Comma && !bVar1) {
        local_118._M_first._M_storage =
             (_Uninitialized<slang::parsing::Token,_true>)
             ParserBase::expect(&this->super_ParserBase,Comma);
        local_108 = local_108 & 0xffffffffffffff00;
        SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                  (local_a8,(TokenOrSyntax *)&local_118._M_first);
        TVar6 = ParserBase::peek(&this->super_ParserBase);
        kind = TVar6.kind;
        bVar1 = slang::syntax::SyntaxFacts::isSemicolon(kind);
        if (kind == EndOfFile || bVar1) {
          ParserBase::reportMisplacedSeparator(&this->super_ParserBase);
          src = extraout_RDX_01;
        }
        else {
          src = extraout_RDX_00;
          if ((local_e0._0_2_ == kind) && ((Info *)local_e0._8_8_ == TVar6.info)) {
            bVar1 = ParserBase::
                    skipBadTokens<&slang::syntax::SyntaxFacts::isIdentifierOrComma,&slang::syntax::SyntaxFacts::isSemicolon>
                              (&this->super_ParserBase,(DiagCode)0x490005,true);
            src = extraout_RDX_02;
            if (!bVar1) goto LAB_001f0c02;
          }
          iVar2 = 0;
          local_e0 = (undefined1  [16])TVar6;
        }
      }
LAB_001f0c02:
      TVar5.info = local_138;
      TVar5.kind = (undefined2)local_130;
      TVar5._2_1_ = local_130._2_1_;
      TVar5.numFlags.raw = local_130._3_1_;
      TVar5.rawLen = local_130._4_4_;
    } while (iVar2 == 0);
    keyword.info = local_138;
    keyword.kind = (undefined2)local_130;
    keyword._2_1_ = local_130._2_1_;
    keyword.numFlags.raw = local_130._3_1_;
    keyword.rawLen = local_130._4_4_;
    TVar5.kind = (undefined2)local_130;
    TVar5._2_1_ = local_130._2_1_;
    TVar5.numFlags.raw = local_130._3_1_;
    TVar5.rawLen = local_130._4_4_;
    if (iVar2 != 3) goto LAB_001f0c5a;
    local_148 = ParserBase::expect(&this->super_ParserBase,Semicolon);
  }
  src = local_148.info;
  keyword = TVar5;
LAB_001f0c5a:
  local_118._8_4_ = 1;
  local_108 = 0;
  uStack_100 = 0;
  local_f8 = local_120;
  local_f0 = local_128;
  local_e8 = local_120;
  local_118._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)&PTR_getChild_0062f0b8;
  iVar2 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                    (local_a8,(EVP_PKEY_CTX *)(this->super_ParserBase).alloc,(EVP_PKEY_CTX *)src);
  local_b8 = (pointer)CONCAT44(extraout_var,iVar2);
  local_e0._8_4_ = 3;
  local_d0 = (SyntaxNode *)0x0;
  pSStack_c8 = (SyntaxNode *)0x0;
  local_e0._0_8_ = &PTR_getChild_0062fce8;
  pPVar4 = slang::syntax::SyntaxFactory::packageImportDeclaration
                     (&this->factory,
                      (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)&local_118._M_first,
                      keyword,(SeparatedSyntaxList<slang::syntax::PackageImportItemSyntax> *)
                              local_e0,local_148);
  local_118._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pPVar4;
  std::
  vector<slang::syntax::PackageImportDeclarationSyntax_const*,std::allocator<slang::syntax::PackageImportDeclarationSyntax_const*>>
  ::emplace_back<slang::syntax::PackageImportDeclarationSyntax_const*>
            ((vector<slang::syntax::PackageImportDeclarationSyntax_const*,std::allocator<slang::syntax::PackageImportDeclarationSyntax_const*>>
              *)&(this->meta).packageImports,(PackageImportDeclarationSyntax **)&local_118._M_rest);
  if (local_a8[0].data_ != (pointer)local_a8[0].firstElement) {
    operator_delete(local_a8[0].data_);
  }
  return pPVar4;
}

Assistant:

PackageImportDeclarationSyntax& Parser::parseImportDeclaration(AttrList attributes) {
    auto keyword = consume();

    Token semi;
    SmallVector<TokenOrSyntax, 4> items;
    parseList<isIdentifierOrComma, isSemicolon>(items, TokenKind::Semicolon, TokenKind::Comma, semi,
                                                RequireItems::True, diag::ExpectedPackageImport,
                                                [this] { return &parsePackageImportItem(); });

    auto& result = factory.packageImportDeclaration(attributes, keyword, items.copy(alloc), semi);
    meta.packageImports.push_back(&result);
    return result;
}